

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::resetToGlobalDomain(HighsLpRelaxation *this)

{
  undefined8 *in_RDI;
  double *in_stack_00000100;
  double *in_stack_00000108;
  HighsInt in_stack_00000110;
  HighsInt in_stack_00000114;
  Highs *in_stack_00000118;
  
  HighsMipSolver::numCol((HighsMipSolver *)*in_RDI);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x604012);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x604028);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x604043);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x604059);
  Highs::changeColsBounds
            (in_stack_00000118,in_stack_00000114,in_stack_00000110,in_stack_00000108,
             in_stack_00000100);
  return;
}

Assistant:

void HighsLpRelaxation::resetToGlobalDomain() {
  lpsolver.changeColsBounds(0, mipsolver.numCol() - 1,
                            mipsolver.mipdata_->domain.col_lower_.data(),
                            mipsolver.mipdata_->domain.col_upper_.data());
}